

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# small_vector.hpp
# Opt level: O3

void __thiscall
pstore::small_vector<int,_4UL>::switch_to_big(small_vector<int,_4UL> *this,size_t new_elements)

{
  pointer piVar1;
  array<int,_4UL> *paVar2;
  
  piVar1 = (this->big_buffer_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_start;
  if ((this->big_buffer_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
      super__Vector_impl_data._M_finish != piVar1) {
    (this->big_buffer_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
    super__Vector_impl_data._M_finish = piVar1;
  }
  std::vector<int,_std::allocator<int>_>::reserve(&this->big_buffer_,new_elements);
  std::__copy_move<false,false,std::random_access_iterator_tag>::
  __copy_m<int*,std::back_insert_iterator<std::vector<int,std::allocator<int>>>>
            (this->buffer_,this->buffer_ + this->elements_,
             (back_insert_iterator<std::vector<int,_std::allocator<int>_>_>)&this->big_buffer_);
  if (new_elements < 5) {
    paVar2 = &this->small_buffer_;
  }
  else {
    paVar2 = (array<int,_4UL> *)
             (this->big_buffer_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_start;
  }
  this->buffer_ = paVar2->_M_elems;
  return;
}

Assistant:

void small_vector<ElementType, BodyElements>::switch_to_big (std::size_t new_elements) {
        big_buffer_.clear ();
        big_buffer_.reserve (new_elements);
        std::copy (buffer_, buffer_ + elements_, std::back_inserter (big_buffer_));
        this->set_buffer_ptr (new_elements);
    }